

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O2

void printFuncHeaderDoc(FILE *out,TA_FuncInfo *funcInfo,char *prefix)

{
  double dVar1;
  TA_InputParameterType TVar2;
  TA_RetCode TVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sStack_50;
  TA_InputParameterInfo *inputParamInfo;
  TA_OptInputParameterInfo *optInputParamInfo;
  TA_OutputParameterInfo *outputParamInfo;
  
  uVar5 = 0;
  fprintf((FILE *)out,"%sTA_%s - %s\n"," * ",funcInfo->name,funcInfo->hint);
  fprintf((FILE *)out,"%s\n"," * ");
  fprintf((FILE *)out,"%sInput  = "," * ");
  while (uVar5 < funcInfo->nbInput) {
    TVar3 = TA_GetInputParameterInfo(funcInfo->handle,uVar5,&inputParamInfo);
    if (TVar3 != TA_SUCCESS) {
      pcVar6 = funcInfo->name;
      pcVar7 = "[%s] invalid \'input\' information\n";
      goto LAB_00116c92;
    }
    TVar2 = inputParamInfo->type;
    if (TVar2 == TA_Input_Integer) {
      pcVar6 = "int";
      sStack_50 = 3;
LAB_00116982:
      fwrite(pcVar6,sStack_50,1,(FILE *)out);
    }
    else {
      if (TVar2 == TA_Input_Real) {
        pcVar6 = "double";
        sStack_50 = 6;
        goto LAB_00116982;
      }
      if (TVar2 == TA_Input_Price) {
        uVar4 = inputParamInfo->flags;
        if ((uVar4 & 1) == 0) {
          if ((uVar4 & 2) != 0) {
LAB_00116884:
            fwrite("High",4,1,(FILE *)out);
            uVar4 = inputParamInfo->flags;
            goto LAB_001168a0;
          }
          if ((uVar4 & 4) != 0) goto LAB_001168b5;
          if ((uVar4 & 8) != 0) goto LAB_001168e6;
          if ((uVar4 & 0x10) != 0) goto LAB_00116917;
          if ((uVar4 & 0x20) != 0) goto LAB_00116948;
          if ((uVar4 & 0x40) == 0) goto LAB_0011698e;
        }
        else {
          fwrite("Open",4,1,(FILE *)out);
          uVar4 = inputParamInfo->flags;
          if ((uVar4 & 2) != 0) {
            fwrite(", ",2,1,(FILE *)out);
            goto LAB_00116884;
          }
LAB_001168a0:
          if ((uVar4 & 4) != 0) {
            fwrite(", ",2,1,(FILE *)out);
LAB_001168b5:
            fwrite("Low",3,1,(FILE *)out);
            uVar4 = inputParamInfo->flags;
          }
          if ((uVar4 & 8) != 0) {
            fwrite(", ",2,1,(FILE *)out);
LAB_001168e6:
            fwrite("Close",5,1,(FILE *)out);
            uVar4 = inputParamInfo->flags;
          }
          if ((uVar4 & 0x10) != 0) {
            fwrite(", ",2,1,(FILE *)out);
LAB_00116917:
            fwrite("Volume",6,1,(FILE *)out);
            uVar4 = inputParamInfo->flags;
          }
          if ((uVar4 & 0x20) != 0) {
            fwrite(", ",2,1,(FILE *)out);
LAB_00116948:
            fwrite("OpenInterest",0xc,1,(FILE *)out);
            uVar4 = inputParamInfo->flags;
          }
          if ((uVar4 & 0x40) == 0) goto LAB_0011698e;
          fwrite(", ",2,1,(FILE *)out);
        }
        pcVar6 = "Timestamp";
        sStack_50 = 9;
        goto LAB_00116982;
      }
    }
LAB_0011698e:
    uVar5 = uVar5 + 1;
    if (uVar5 == funcInfo->nbInput) {
      fputc(10,(FILE *)out);
    }
    else {
      fwrite(", ",2,1,(FILE *)out);
    }
  }
  uVar5 = 0;
  fprintf((FILE *)out,"%sOutput = "," * ");
  while (uVar5 < funcInfo->nbOutput) {
    TVar3 = TA_GetOutputParameterInfo(funcInfo->handle,uVar5,&outputParamInfo);
    if (TVar3 != TA_SUCCESS) {
      pcVar6 = funcInfo->name;
      pcVar7 = "[%s] invalid \'output\' information\n";
      goto LAB_00116c92;
    }
    if (outputParamInfo->type == TA_Output_Integer) {
      pcVar6 = "const int";
      sStack_50 = 3;
LAB_00116a25:
      fwrite(pcVar6 + 6,sStack_50,1,(FILE *)out);
    }
    else if (outputParamInfo->type == TA_Output_Real) {
      pcVar6 = "const double";
      sStack_50 = 6;
      goto LAB_00116a25;
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == funcInfo->nbOutput) {
      fputc(10,(FILE *)out);
    }
    else {
      fwrite(", ",2,1,(FILE *)out);
    }
  }
  if (funcInfo->nbOptInput != 0) {
    fprintf((FILE *)out,"%s\n"," * ");
    fprintf((FILE *)out,"%sOptional Parameters\n"," * ");
    fprintf((FILE *)out,"%s-------------------\n"," * ");
    for (uVar5 = 0; uVar5 < funcInfo->nbOptInput; uVar5 = uVar5 + 1) {
      TVar3 = TA_GetOptInputParameterInfo(funcInfo->handle,uVar5,&optInputParamInfo);
      if (TVar3 != TA_SUCCESS) {
        pcVar6 = funcInfo->name;
        pcVar7 = "[%s] invalid \'optional input\' information\n";
LAB_00116c92:
        printf(pcVar7,pcVar6);
        return;
      }
      pcVar6 = optInputParamInfo->paramName;
      if (3 < (ulong)optInputParamInfo->type) {
        pcVar7 = "optInParam";
        if (pcVar6 != (char *)0x0) {
          pcVar7 = pcVar6;
        }
        printf("[%s,%s,%d] invalid \'optional input\' type(%d)\n",funcInfo->name,pcVar7,(ulong)uVar5
              );
        return;
      }
      pcVar7 = &DAT_0011a038 + *(int *)(&DAT_0011a038 + (ulong)optInputParamInfo->type * 4);
      if (pcVar6 != (char *)0x0) {
        pcVar7 = pcVar6;
      }
      fprintf((FILE *)out,"%s%s:"," * ",pcVar7);
      if (optInputParamInfo->type == TA_OptInput_IntegerRange) {
        if (*optInputParamInfo->dataSet == -0x7fffffff) {
          fwrite("(From TA_INTEGER_MIN",0x14,1,(FILE *)out);
        }
        else {
          fprintf((FILE *)out,"(From %d");
        }
        if (*(int *)((long)optInputParamInfo->dataSet + 4) == 0x7fffffff) {
          pcVar6 = " to TA_INTEGER_MAX)\n";
          sStack_50 = 0x14;
LAB_00116c16:
          fwrite(pcVar6,sStack_50,1,(FILE *)out);
        }
        else {
          fprintf((FILE *)out," to %d)\n");
        }
      }
      else if (optInputParamInfo->type == TA_OptInput_RealRange) {
        dVar1 = *optInputParamInfo->dataSet;
        if ((dVar1 != -3e+37) || (NAN(dVar1))) {
          fprintf((FILE *)out,"(From %.*g",(ulong)*(uint *)((long)optInputParamInfo->dataSet + 0x10)
                 );
        }
        else {
          fwrite("(From TA_REAL_MIN",0x11,1,(FILE *)out);
        }
        dVar1 = *(double *)((long)optInputParamInfo->dataSet + 8);
        if ((dVar1 == 3e+37) && (!NAN(dVar1))) {
          pcVar6 = " to TA_REAL_MAX)\n";
          sStack_50 = 0x11;
          goto LAB_00116c16;
        }
        pcVar6 = " %";
        if (((uint)optInputParamInfo->flags >> 0x14 & 1) == 0) {
          pcVar6 = "";
        }
        fprintf((FILE *)out," to %.*g%s)\n",
                (ulong)*(uint *)((long)optInputParamInfo->dataSet + 0x10),pcVar6);
      }
      else {
        fputc(10,(FILE *)out);
      }
      fprintf((FILE *)out,"%s   %s\n"," * ",optInputParamInfo->hint);
      fprintf((FILE *)out,"%s\n"," * ");
    }
  }
  fprintf((FILE *)out,"%s\n"," * ");
  return;
}

Assistant:

static void printFuncHeaderDoc( FILE *out,
                                const TA_FuncInfo *funcInfo,
                                const char *prefix )
{
   TA_RetCode retCode;
   unsigned int paramNb;
   const char *paramName;
   const char *defaultParamName;
   const TA_InputParameterInfo *inputParamInfo;
   const TA_OptInputParameterInfo *optInputParamInfo;
   const TA_OutputParameterInfo *outputParamInfo;
   int first;

   fprintf( out, "%sTA_%s - %s\n", prefix, funcInfo->name, funcInfo->hint );
   fprintf( out, "%s\n", prefix );


   fprintf( out, "%sInput  = ", prefix );
   for( paramNb=0; paramNb < funcInfo->nbInput; paramNb++ )
   {
      retCode = TA_GetInputParameterInfo( funcInfo->handle,
                                          paramNb, &inputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'input' information\n", funcInfo->name );
         return;
      }

      switch( inputParamInfo->type )
      {
      case TA_Input_Price:
         first = 1;
         #define PRICE_PARAM(upperParam,lowerParam) \
         { \
            if( inputParamInfo->flags & TA_IN_PRICE_##upperParam ) \
            { \
               if( !first ) fprintf( out, ", " ); \
               fprintf( out, lowerParam ); \
               first = 0; \
            } \
         }

         PRICE_PARAM( OPEN,         "Open" );
         PRICE_PARAM( HIGH,         "High" );
         PRICE_PARAM( LOW,          "Low" );
         PRICE_PARAM( CLOSE,        "Close" );
         PRICE_PARAM( VOLUME,       "Volume" );
         PRICE_PARAM( OPENINTEREST, "OpenInterest" );
         PRICE_PARAM( TIMESTAMP,    "Timestamp" );

         #undef PRICE_PARAM

         break;
      case TA_Input_Integer:
         fprintf( out, "int" );
         break;
      case TA_Input_Real:
         fprintf( out, "double" );
         break;
      }
      if( paramNb+1 == funcInfo->nbInput )
         fprintf( out, "\n" );
      else
         fprintf( out, ", " );
   }

   fprintf( out, "%sOutput = ", prefix );
   for( paramNb=0; paramNb < funcInfo->nbOutput; paramNb++ )
   {
      retCode = TA_GetOutputParameterInfo( funcInfo->handle,
                                           paramNb, &outputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'output' information\n", funcInfo->name );
         return;
      }

      switch( outputParamInfo->type )
      {
      case TA_Output_Real:
         fprintf( out, "double" );
         break;
      case TA_Output_Integer:
         fprintf( out, "int" );
         break;
      }
      if( paramNb+1 == funcInfo->nbOutput )
         fprintf( out, "\n" );
      else
         fprintf( out, ", " );
   }

   if( funcInfo->nbOptInput != 0 )
   {
      fprintf( out, "%s\n", prefix );
      fprintf( out, "%sOptional Parameters\n", prefix );
      fprintf( out, "%s-------------------\n", prefix );

      for( paramNb=0; paramNb < funcInfo->nbOptInput; paramNb++ )
      {
         retCode = TA_GetOptInputParameterInfo( funcInfo->handle,
                                                paramNb, &optInputParamInfo );

         if( retCode != TA_SUCCESS )
         {
            printf( "[%s] invalid 'optional input' information\n", funcInfo->name );
            return;
         }

         paramName = optInputParamInfo->paramName;

         switch( optInputParamInfo->type )
         {
         case TA_OptInput_RealRange:
         case TA_OptInput_RealList:
            defaultParamName = "optInReal";
            break;
         case TA_OptInput_IntegerRange:
         case TA_OptInput_IntegerList:
            defaultParamName = "optInInteger";
            break;
         default:
            if( !paramName )
               paramName = "optInParam";
            printf( "[%s,%s,%d] invalid 'optional input' type(%d)\n",
                    funcInfo->name, paramName, paramNb,
                    optInputParamInfo->type );
            return;
         }

         if( !paramName )
            paramName = defaultParamName;

         fprintf( out, "%s%s:", prefix, paramName );
         switch( optInputParamInfo->type )
         {
         case TA_OptInput_RealRange:
               if( ((TA_RealRange *)(optInputParamInfo->dataSet))->min == TA_REAL_MIN )
                  fprintf( out, "(From TA_REAL_MIN" );
               else
               {
                  fprintf( out, "(From %.*g",
                           ((TA_RealRange *)(optInputParamInfo->dataSet))->precision,
                           ((TA_RealRange *)(optInputParamInfo->dataSet))->min );
               }

               if( ((TA_RealRange *)(optInputParamInfo->dataSet))->max == TA_REAL_MAX )
                  fprintf( out, " to TA_REAL_MAX)\n" );
               else
               {
                  fprintf( out, " to %.*g%s)\n",
                          ((TA_RealRange *)(optInputParamInfo->dataSet))->precision,
                          ((TA_RealRange *)(optInputParamInfo->dataSet))->max,
                          optInputParamInfo->flags & TA_OPTIN_IS_PERCENT? " %":"" );
               }
               break;
         case TA_OptInput_IntegerRange:
               if( ((TA_IntegerRange *)(optInputParamInfo->dataSet))->min == TA_INTEGER_MIN )
                  fprintf( out, "(From TA_INTEGER_MIN" );
               else
               {
                  fprintf( out, "(From %d",
                           ((TA_IntegerRange *)(optInputParamInfo->dataSet))->min );
               }

               if( ((TA_IntegerRange *)(optInputParamInfo->dataSet))->max == TA_INTEGER_MAX )
                  fprintf( out, " to TA_INTEGER_MAX)\n" );
               else
               {
                  fprintf( out, " to %d)\n",
                          ((TA_IntegerRange *)(optInputParamInfo->dataSet))->max );
               }
               break;
         default:
             fprintf( out, "\n" );
         }
         fprintf( out, "%s   %s\n", prefix, optInputParamInfo->hint );
         fprintf( out, "%s\n", prefix );
      }
   }

   fprintf( out, "%s\n", prefix );
}